

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall
ncnn::NetPrivate::convert_layout(NetPrivate *this,Mat *bottom_blob,Layer *layer,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Mat bottom_blob_bf16;
  
  if ((opt->use_bf16_storage == true) && (iVar4 = bottom_blob->elempack, iVar4 != 0)) {
    if ((((int)bottom_blob->elemsize << 3) / iVar4 == 0x20) && (layer->support_bf16_storage == true)
       ) {
      bottom_blob_bf16.cstep = 0;
      bottom_blob_bf16.data = (void *)0x0;
      bottom_blob_bf16.refcount._0_4_ = 0;
      bottom_blob_bf16.refcount._4_4_ = 0;
      bottom_blob_bf16.elemsize._0_4_ = 0;
      bottom_blob_bf16._20_8_ = 0;
      bottom_blob_bf16.allocator = (Allocator *)0x0;
      bottom_blob_bf16.dims = 0;
      bottom_blob_bf16.w = 0;
      bottom_blob_bf16.h = 0;
      bottom_blob_bf16.d = 0;
      bottom_blob_bf16.c = 0;
      cast_float32_to_bfloat16(bottom_blob,&bottom_blob_bf16,opt);
      Mat::operator=(bottom_blob,&bottom_blob_bf16);
      Mat::~Mat(&bottom_blob_bf16);
      iVar4 = bottom_blob->elempack;
      if (iVar4 == 0) goto LAB_00145b21;
    }
    if ((((int)bottom_blob->elemsize << 3) / iVar4 == 0x10) &&
       (layer->support_bf16_storage == false)) {
      bottom_blob_bf16.cstep = 0;
      bottom_blob_bf16.data = (void *)0x0;
      bottom_blob_bf16.refcount._0_4_ = 0;
      bottom_blob_bf16.refcount._4_4_ = 0;
      bottom_blob_bf16.elemsize._0_4_ = 0;
      bottom_blob_bf16._20_8_ = 0;
      bottom_blob_bf16.allocator = (Allocator *)0x0;
      bottom_blob_bf16.dims = 0;
      bottom_blob_bf16.w = 0;
      bottom_blob_bf16.h = 0;
      bottom_blob_bf16.d = 0;
      bottom_blob_bf16.c = 0;
      cast_bfloat16_to_float32(bottom_blob,&bottom_blob_bf16,opt);
      Mat::operator=(bottom_blob,&bottom_blob_bf16);
      Mat::~Mat(&bottom_blob_bf16);
    }
  }
LAB_00145b21:
  if (opt->use_packing_layout != true) {
    return 0;
  }
  iVar3 = bottom_blob->elempack;
  iVar4 = bottom_blob->dims;
  iVar2 = 0;
  uVar5 = bottom_blob->w * iVar3;
  if (iVar4 != 1) {
    uVar5 = 0;
  }
  uVar1 = bottom_blob->h * iVar3;
  if (iVar4 != 2) {
    uVar1 = uVar5;
  }
  uVar5 = bottom_blob->c * iVar3;
  if (iVar4 != 3) {
    uVar5 = uVar1;
  }
  if (iVar3 == 0) {
    iVar3 = 1;
    iVar4 = 1;
    if (layer->support_packing == false) goto LAB_00145be8;
LAB_00145bc0:
    iVar4 = 4;
    if ((uVar5 & 3) != 0 || iVar2 != 0x10) {
      iVar4 = iVar3;
    }
    if ((uVar5 & 7) == 0 && iVar2 == 8) {
      iVar4 = 8;
    }
    iVar3 = bottom_blob->elempack;
  }
  else {
    if (layer->support_packing != false) {
      iVar2 = ((int)bottom_blob->elemsize << 3) / iVar3;
      if (iVar2 == 0x20) {
        iVar2 = 0x20;
        if (((uVar5 & 7) == 0) &&
           ((iVar4 = cpu_support_x86_avx2(), iVar4 != 0 ||
            (iVar4 = cpu_support_x86_avx(), iVar4 != 0)))) {
          iVar3 = 8;
        }
        else {
          iVar3 = (uint)((uVar5 & 3) == 0) * 3 + 1;
        }
      }
      else {
        iVar3 = 1;
      }
      goto LAB_00145bc0;
    }
    iVar4 = 1;
  }
  if (iVar3 == iVar4) {
    return 0;
  }
LAB_00145be8:
  bottom_blob_bf16.cstep = 0;
  bottom_blob_bf16.data = (void *)0x0;
  bottom_blob_bf16.refcount._0_4_ = 0;
  bottom_blob_bf16.refcount._4_4_ = 0;
  bottom_blob_bf16.elemsize._0_4_ = 0;
  bottom_blob_bf16._20_8_ = 0;
  bottom_blob_bf16.allocator = (Allocator *)0x0;
  bottom_blob_bf16.dims = 0;
  bottom_blob_bf16.w = 0;
  bottom_blob_bf16.h = 0;
  bottom_blob_bf16.d = 0;
  bottom_blob_bf16.c = 0;
  convert_packing(bottom_blob,&bottom_blob_bf16,iVar4,opt);
  Mat::operator=(bottom_blob,&bottom_blob_bf16);
  Mat::~Mat(&bottom_blob_bf16);
  return 0;
}

Assistant:

int NetPrivate::convert_layout(Mat& bottom_blob, const Layer* layer, const Option& opt) const
{
    // clang-format off
    // *INDENT-OFF*
#if NCNN_ARM82
    if (opt.use_fp16_storage && cpu_support_arm_asimdhp())
    {
        if (bottom_blob.elembits() == 32 && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_ARM82
#if NCNN_RVV
    if (opt.use_fp16_storage && cpu_support_riscv_v() && cpu_support_riscv_zfh())
    {
        if (bottom_blob.elembits() == 32 && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_RVV
#if NCNN_BF16
    if (opt.use_bf16_storage)
    {
        if (bottom_blob.elembits() == 32 && layer->support_bf16_storage)
        {
            Mat bottom_blob_bf16;
            cast_float32_to_bfloat16(bottom_blob, bottom_blob_bf16, opt);
            bottom_blob = bottom_blob_bf16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_bf16_storage)
        {
            Mat bottom_blob_fp32;
            cast_bfloat16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_BF16
    {
        // no type conversion
    }
    // *INDENT-ON*
    // clang-format on

    if (opt.use_packing_layout)
    {
        // resolve dst_elempack
        int dims = bottom_blob.dims;
        int elemcount = 0;
        if (dims == 1) elemcount = bottom_blob.elempack * bottom_blob.w;
        if (dims == 2) elemcount = bottom_blob.elempack * bottom_blob.h;
        if (dims == 3) elemcount = bottom_blob.elempack * bottom_blob.c;

        int elembits = bottom_blob.elembits();

        int dst_elempack = 1;
        if (layer->support_packing)
        {
            if (elembits == 32)
            {
#if (NCNN_AVX2 || NCNN_AVX)
                if (elemcount % 8 == 0 && (ncnn::cpu_support_x86_avx2() || ncnn::cpu_support_x86_avx()))
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 4;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 16)
            {
#if NCNN_ARM82
                if (elemcount % 8 == 0 && opt.use_fp16_storage && opt.use_fp16_arithmetic && layer->support_fp16_storage)
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 2;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 8)
            {
#if NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 1;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 8 == 0)
                    dst_elempack = 8;
#endif
            }
        }

        if (bottom_blob.elempack != dst_elempack)
        {
            Mat bottom_blob_packed;
            convert_packing(bottom_blob, bottom_blob_packed, dst_elempack, opt);
            bottom_blob = bottom_blob_packed;
        }
    }

    return 0;
}